

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,SrcList *pSrcList,int iSrc)

{
  byte *pbVar1;
  ExprList *pEVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Select *pSVar6;
  CollSeq *pCVar7;
  Expr *pEVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ExprList_item *pEVar12;
  long in_FS_OFFSET;
  undefined1 local_60 [24];
  ExprList *local_48;
  ExprList *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 0;
  if (((pWhere != (Expr *)0x0) && ((pSubq->selFlags & 0x2002000) == 0)) &&
     ((pSrcList->a[iSrc].fg.jointype & 0x50) == 0)) {
    if (pSubq->pPrior == (Select *)0x0) {
      if ((pSubq->pWin != (Window *)0x0) && (iVar4 = 0, pSubq->pWin->pPartition == (ExprList *)0x0))
      goto LAB_0017f922;
    }
    else {
      bVar3 = false;
      for (pSVar6 = pSubq; pSVar6 != (Select *)0x0; pSVar6 = pSVar6->pPrior) {
        if ((pSVar6->op != 0x88) && (pSVar6->op != 0x8b)) {
          bVar3 = true;
        }
        if (pSVar6->pWin != (Window *)0x0) goto LAB_0017f916;
      }
      pSVar6 = pSubq;
      if (bVar3) {
        for (; pSVar6 != (Select *)0x0; pSVar6 = pSVar6->pPrior) {
          pEVar2 = pSVar6->pEList;
          pEVar12 = pEVar2->a;
          for (lVar10 = 0; lVar10 < pEVar2->nExpr; lVar10 = lVar10 + 1) {
            pCVar7 = sqlite3ExprCollSeq(pParse,pEVar12->pExpr);
            if ((pCVar7 != (CollSeq *)0x0) && (pCVar7->xCmp != binCollFunc)) goto LAB_0017f916;
            pEVar12 = pEVar12 + 1;
          }
        }
      }
    }
    iVar4 = 0;
    if (pSubq->pLimit == (Expr *)0x0) {
      iVar9 = 0;
      for (; pWhere->op == ','; pWhere = pWhere->pLeft) {
        iVar4 = pushDownWhereTerms(pParse,pSubq,pWhere->pRight,pSrcList,iSrc);
        iVar9 = iVar9 + iVar4;
      }
      iVar5 = sqlite3ExprIsSingleTableConstraint(pWhere,pSrcList,iSrc,1);
      iVar4 = iVar9;
      if (iVar5 != 0) {
        iVar4 = iVar9 + 1;
        pbVar1 = (byte *)((long)&pSubq->selFlags + 3);
        *pbVar1 = *pbVar1 | 1;
        for (; pSubq != (Select *)0x0; pSubq = pSubq->pPrior) {
          local_60._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pEVar8 = sqlite3ExprDup(pParse->db,pWhere,0);
          unsetJoinExpr(pEVar8,-1,1);
          local_60._8_4_ = pSrcList->a[iSrc].iCursor;
          local_60._16_8_ = local_60._16_8_ & 0xffffffff00000000;
          local_48 = pSubq->pEList;
          local_60._0_8_ = pParse;
          local_60._12_4_ = local_60._8_4_;
          local_40 = findLeftmostExprlist(pSubq);
          pEVar8 = substExpr((SubstContext *)local_60,pEVar8);
          if ((pSubq->pWin != (Window *)0x0) &&
             (iVar5 = sqlite3ExprIsConstantOrGroupBy(pParse,pEVar8,pSubq->pWin->pPartition),
             iVar5 == 0)) {
            sqlite3ExprDelete(pParse->db,pEVar8);
            iVar4 = iVar9;
            break;
          }
          uVar11 = (ulong)(pSubq->selFlags & 8);
          pEVar8 = sqlite3ExprAnd(pParse,*(Expr **)((long)pSubq->addrOpenEphm + uVar11 * 2 + 0x1c),
                                  pEVar8);
          *(Expr **)((long)pSubq->addrOpenEphm + uVar11 * 2 + 0x1c) = pEVar8;
        }
      }
    }
  }
LAB_0017f922:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
LAB_0017f916:
  iVar4 = 0;
  goto LAB_0017f922;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  SrcList *pSrcList,    /* The complete from clause of the outer query */
  int iSrc              /* Which FROM clause term to try to push into  */
){
  Expr *pNew;
  SrcItem *pSrc;        /* The subquery FROM term into which WHERE is pushed */
  int nChng = 0;
  pSrc = &pSrcList->a[iSrc];
  if( pWhere==0 ) return 0;
  if( pSubq->selFlags & (SF_Recursive|SF_MultiPart) ){
    return 0;           /* restrictions (2) and (11) */
  }
  if( pSrc->fg.jointype & (JT_LTORJ|JT_RIGHT) ){
    return 0;           /* restrictions (10) */
  }

  if( pSubq->pPrior ){
    Select *pSel;
    int notUnionAll = 0;
    for(pSel=pSubq; pSel; pSel=pSel->pPrior){
      u8 op = pSel->op;
      assert( op==TK_ALL || op==TK_SELECT
           || op==TK_UNION || op==TK_INTERSECT || op==TK_EXCEPT );
      if( op!=TK_ALL && op!=TK_SELECT ){
        notUnionAll = 1;
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( pSel->pWin ) return 0;    /* restriction (6b) */
#endif
    }
    if( notUnionAll ){
      /* If any of the compound arms are connected using UNION, INTERSECT,
      ** or EXCEPT, then we must ensure that none of the columns use a
      ** non-BINARY collating sequence. */
      for(pSel=pSubq; pSel; pSel=pSel->pPrior){
        int ii;
        const ExprList *pList = pSel->pEList;
        assert( pList!=0 );
        for(ii=0; ii<pList->nExpr; ii++){
          CollSeq *pColl = sqlite3ExprCollSeq(pParse, pList->a[ii].pExpr);
          if( !sqlite3IsBinary(pColl) ){
            return 0;  /* Restriction (8) */
          }
        }
      }
    }
  }else{
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( pSubq->pWin && pSubq->pWin->pPartition==0 ) return 0;
#endif
  }

#ifdef SQLITE_DEBUG
  /* Only the first term of a compound can have a WITH clause.  But make
  ** sure no other terms are marked SF_Recursive in case something changes
  ** in the future.
  */
  {
    Select *pX;
    for(pX=pSubq; pX; pX=pX->pPrior){
      assert( (pX->selFlags & (SF_Recursive))==0 );
    }
  }
#endif

  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight, pSrcList, iSrc);
    pWhere = pWhere->pLeft;
  }

#if 0 /* These checks now done by sqlite3ExprIsSingleTableConstraint() */
  if( ExprHasProperty(pWhere, EP_OuterON|EP_InnerON) /* (9a) */
   && (pSrcList->a[0].fg.jointype & JT_LTORJ)!=0     /* Fast pre-test of (9c) */
  ){
    int jj;
    for(jj=0; jj<iSrc; jj++){
      if( pWhere->w.iJoin==pSrcList->a[jj].iCursor ){
        /* If we reach this point, both (9a) and (9b) are satisfied.
        ** The following loop checks (9c):
        */
        for(jj++; jj<iSrc; jj++){
          if( (pSrcList->a[jj].fg.jointype & JT_RIGHT)!=0 ){
            return 0;  /* restriction (9) */
          }
        }
      }
    }
  }
  if( isLeftJoin
   && (ExprHasProperty(pWhere,EP_OuterON)==0
         || pWhere->w.iJoin!=iCursor)
  ){
    return 0; /* restriction (4) */
  }
  if( ExprHasProperty(pWhere,EP_OuterON)
   && pWhere->w.iJoin!=iCursor
  ){
    return 0; /* restriction (5) */
  }
#endif

#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
  if( ViewCanHaveRowid && (pWhere->op==TK_ISNULL || pWhere->op==TK_NOTNULL) ){
    Expr *pLeft = pWhere->pLeft;
    if( ALWAYS(pLeft)
     && pLeft->op==TK_COLUMN
     && pLeft->iColumn < 0
    ){
      return 0;  /* Restriction (12) */
    }
  }
#endif

  if( sqlite3ExprIsSingleTableConstraint(pWhere, pSrcList, iSrc, 1) ){
    nChng++;
    pSubq->selFlags |= SF_PushDown;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      unsetJoinExpr(pNew, -1, 1);
      x.pParse = pParse;
      x.iTable = pSrc->iCursor;
      x.iNewTable = pSrc->iCursor;
      x.isOuterJoin = 0;
      x.pEList = pSubq->pEList;
      x.pCList = findLeftmostExprlist(pSubq);
      pNew = substExpr(&x, pNew);
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( pSubq->pWin && 0==pushDownWindowCheck(pParse, pSubq, pNew) ){
        /* Restriction 6c has prevented push-down in this case */
        sqlite3ExprDelete(pParse->db, pNew);
        nChng--;
        break;
      }
#endif
      if( pSubq->selFlags & SF_Aggregate ){
        pSubq->pHaving = sqlite3ExprAnd(pParse, pSubq->pHaving, pNew);
      }else{
        pSubq->pWhere = sqlite3ExprAnd(pParse, pSubq->pWhere, pNew);
      }
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}